

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O3

pair<ska::detailv3::sherwood_v3_table<std::pair<std::type_index,_std::any>,_std::type_index,_slang::Hasher<std::type_index>,_ska::detailv3::KeyOrValueHasher<std::type_index,_std::pair<std::type_index,_std::any>,_slang::Hasher<std::type_index>_>,_std::equal_to<std::type_index>,_ska::detailv3::KeyOrValueEquality<std::type_index,_std::pair<std::type_index,_std::any>,_std::equal_to<std::type_index>_>,_std::allocator<std::pair<std::type_index,_std::any>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,_std::any>_>_>_>::templated_iterator<std::pair<std::type_index,_std::any>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<std::type_index,std::any>,std::type_index,slang::Hasher<std::type_index>,ska::detailv3::KeyOrValueHasher<std::type_index,std::pair<std::type_index,std::any>,slang::Hasher<std::type_index>>,std::equal_to<std::type_index>,ska::detailv3::KeyOrValueEquality<std::type_index,std::pair<std::type_index,std::any>,std::equal_to<std::type_index>>,std::allocator<std::pair<std::type_index,std::any>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,std::any>>>>
::
emplace<std::type_index,ska::flat_hash_map<std::type_index,std::any,slang::Hasher<std::type_index>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index,std::any>>>::convertible_to_value>
          (sherwood_v3_table<std::pair<std::type_index,std::any>,std::type_index,slang::Hasher<std::type_index>,ska::detailv3::KeyOrValueHasher<std::type_index,std::pair<std::type_index,std::any>,slang::Hasher<std::type_index>>,std::equal_to<std::type_index>,ska::detailv3::KeyOrValueEquality<std::type_index,std::pair<std::type_index,std::any>,std::equal_to<std::type_index>>,std::allocator<std::pair<std::type_index,std::any>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,std::any>>>>
           *this,type_index *key,convertible_to_value *args)

{
  EntryPointer psVar1;
  bool bVar2;
  size_t sVar3;
  EntryPointer current_entry;
  char distance_from_desired;
  long lVar4;
  EntryPointer psVar5;
  pair<ska::detailv3::sherwood_v3_table<std::pair<std::type_index,_std::any>,_std::type_index,_slang::Hasher<std::type_index>,_ska::detailv3::KeyOrValueHasher<std::type_index,_std::pair<std::type_index,_std::any>,_slang::Hasher<std::type_index>_>,_std::equal_to<std::type_index>,_ska::detailv3::KeyOrValueEquality<std::type_index,_std::pair<std::type_index,_std::any>,_std::equal_to<std::type_index>_>,_std::allocator<std::pair<std::type_index,_std::any>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,_std::any>_>_>_>::templated_iterator<std::pair<std::type_index,_std::any>_>,_bool>
  pVar6;
  
  sVar3 = std::type_info::hash_code(key->_M_target);
  lVar4 = (sVar3 * -0x61c8864680b583eb >> ((byte)this[0x10] & 0x3f)) * 0x20;
  current_entry = (EntryPointer)(*(long *)this + lVar4);
  if (*(char *)(*(long *)this + lVar4) < '\0') {
    distance_from_desired = '\0';
  }
  else {
    distance_from_desired = '\0';
    psVar5 = current_entry;
    do {
      bVar2 = std::type_index::operator==(key,&(psVar5->field_1).value.first);
      if (bVar2) {
        pVar6._8_8_ = 0;
        pVar6.first.current = psVar5;
        return pVar6;
      }
      current_entry = psVar5 + 1;
      distance_from_desired = distance_from_desired + '\x01';
      psVar1 = psVar5 + 1;
      psVar5 = current_entry;
    } while (distance_from_desired <= psVar1->distance_from_desired);
  }
  pVar6 = emplace_new_key<std::type_index,ska::flat_hash_map<std::type_index,std::any,slang::Hasher<std::type_index>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index,std::any>>>::convertible_to_value>
                    (this,distance_from_desired,current_entry,key,args);
  return pVar6;
}

Assistant:

std::pair<iterator, bool> emplace(Key && key, Args &&... args)
    {
        size_t index = hash_policy.index_for_hash(hash_object(key), num_slots_minus_one);
        EntryPointer current_entry = entries + ptrdiff_t(index);
        int8_t distance_from_desired = 0;
        for (; current_entry->distance_from_desired >= distance_from_desired; ++current_entry, ++distance_from_desired)
        {
            if (compares_equal(key, current_entry->value))
                return { { current_entry }, false };
        }
        return emplace_new_key(distance_from_desired, current_entry, std::forward<Key>(key), std::forward<Args>(args)...);
    }